

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

duration __thiscall
timertt::details::
manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
::timeout_before_nearest_timer<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>
           *this,duration<long,_std::ratio<1L,_1000000000L>_> default_timeout)

{
  long lVar1;
  tuple<bool,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  r;
  _Any_data local_20;
  
  manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  ::nearest_time_point
            ((manager_impl_template<timertt::details::timer_wheel_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
              *)&local_20);
  if (local_20._M_pod_data[8] == '\x01') {
    lVar1 = std::chrono::_V2::steady_clock::now();
    default_timeout.__r = 0;
    if (lVar1 <= (long)local_20._M_unused._0_8_) {
      default_timeout.__r = (long)local_20._M_unused._0_8_ - lVar1;
    }
  }
  return (duration)default_timeout.__r;
}

Assistant:

monotonic_clock::duration
	timeout_before_nearest_timer(
		//! Default timeout value which will be used if there is no any timers.
		DURATION default_timeout )
	{
		auto r = this->nearest_time_point();
		if( std::get<0>( r ) )
		{
			auto now = monotonic_clock::now();
			const auto & f = std::get<1>( r );
			if( now > f )
				return monotonic_clock::duration( 0 );
			else
				return (f - now);
		}
		else
			return default_timeout;
	}